

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,void>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_> *alloc_ref)

{
  ctrl_t *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (this->old_capacity_ != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        lVar2 = *(long *)((long)&this->old_heap_or_soo_ + 8);
        lVar3 = *(long *)((long)&c->heap_or_soo_ + 8);
        lVar4 = 0;
        uVar5 = 0;
        do {
          if (kSentinel < pcVar1[uVar5]) {
            *(undefined8 *)(lVar3 + 0x20 + lVar4) = *(undefined8 *)(lVar2 + lVar4);
            *(undefined8 *)(lVar3 + 0x28 + lVar4) = *(undefined8 *)(lVar2 + 8 + lVar4);
            *(undefined8 *)(lVar3 + 0x30 + lVar4) = *(undefined8 *)(lVar2 + 0x10 + lVar4);
            *(undefined8 *)(lVar2 + lVar4) = 0;
            ((undefined8 *)(lVar2 + lVar4))[1] = 0;
            *(undefined8 *)(lVar2 + 0x10 + lVar4) = 0;
            *(undefined4 *)(lVar3 + 0x38 + lVar4) = *(undefined4 *)(lVar2 + 0x18 + lVar4);
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (uVar5 < this->old_capacity_);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }